

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collation_binding.cpp
# Opt level: O1

bool duckdb::PushVarcharCollation
               (ClientContext *context,
               unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *source
               ,LogicalType *sql_type,CollationType type)

{
  reference_wrapper<duckdb::CollateCatalogEntry> *prVar1;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  pointer pcVar3;
  size_type sVar4;
  reference_wrapper<duckdb::CollateCatalogEntry> *prVar5;
  undefined1 auVar6 [8];
  undefined8 uVar7;
  int iVar8;
  const_iterator cVar9;
  reference pvVar10;
  BinderException *this;
  long lVar11;
  undefined8 uVar12;
  bind_scalar_function_t *pp_Var13;
  undefined8 *puVar14;
  CollateCatalogEntry *pCVar15;
  reference_wrapper<duckdb::CollateCatalogEntry> *prVar16;
  bool bVar17;
  byte bVar18;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  children;
  vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_true> entries;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> function;
  string collation;
  FunctionBinder function_binder;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  splits;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  collations;
  string str_collation;
  undefined1 local_2b8 [44];
  CollationType local_28c;
  vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
  local_288;
  Catalog *local_270;
  undefined1 local_268 [8];
  string local_260;
  undefined1 local_240 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  undefined1 local_210 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  float local_1f0;
  pointer local_1e8;
  undefined1 auStack_1e0 [16];
  pointer pLStack_1d0;
  __atomic_base<unsigned_long> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  string local_178;
  BaseScalarFunction local_158;
  _Any_data local_a8;
  pointer local_98;
  undefined8 local_88 [9];
  _Any_data local_40;
  
  bVar18 = 0;
  if (sql_type->id_ == VARCHAR) {
    local_240._16_8_ = source;
    StringType::GetCollation_abi_cxx11_(&local_178,(StringType *)sql_type,sql_type);
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    local_260._M_string_length = 0;
    local_260.field_2._M_local_buf[0] = '\0';
    if ((_Hash_node_base *)local_178._M_string_length == (_Hash_node_base *)0x0) {
      DBConfig::GetConfig(context);
    }
    ::std::__cxx11::string::_M_assign((string *)(local_268 + 8));
    local_28c = type;
    StringUtil::Lower((string *)local_210,(string *)(local_268 + 8));
    ::std::__cxx11::string::operator=((string *)(local_268 + 8),(string *)local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._0_8_ != &local_200) {
      operator_delete((void *)local_210._0_8_);
    }
    if ((((local_260._M_string_length == 0) ||
         (iVar8 = ::std::__cxx11::string::compare(local_268 + 8), iVar8 == 0)) ||
        (iVar8 = ::std::__cxx11::string::compare(local_268 + 8), iVar8 == 0)) ||
       (iVar8 = ::std::__cxx11::string::compare(local_268 + 8), iVar8 == 0)) {
      bVar17 = false;
    }
    else {
      local_270 = Catalog::GetSystemCatalog(context);
      StringUtil::Lower((string *)local_210,(string *)(local_268 + 8));
      local_2b8._0_8_ = local_2b8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,".","");
      StringUtil::Split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                         *)(local_240 + 0x18),(string *)local_210,(string *)local_2b8);
      if ((CollateCatalogEntry *)local_2b8._0_8_ != (CollateCatalogEntry *)(local_2b8 + 0x10)) {
        operator_delete((void *)local_2b8._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._0_8_ != &local_200) {
        operator_delete((void *)local_210._0_8_);
      }
      local_288.
      super__Vector_base<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (reference_wrapper<duckdb::CollateCatalogEntry> *)0x0;
      local_288.
      super__Vector_base<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (reference_wrapper<duckdb::CollateCatalogEntry> *)0x0;
      local_288.
      super__Vector_base<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (reference_wrapper<duckdb::CollateCatalogEntry> *)0x0;
      local_210._0_8_ = auStack_1e0;
      local_210._8_8_ = 1;
      local_200._M_allocated_capacity = 0;
      local_200._8_8_ = 0;
      local_1f0 = 1.0;
      local_1e8 = (pointer)0x0;
      auStack_1e0._0_8_ = 0;
      prVar5 = local_288.
               super__Vector_base<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (uVar12 = local_228._M_allocated_capacity;
          local_288.
          super__Vector_base<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = prVar5, uVar12 != local_228._8_8_;
          uVar12 = uVar12 + 0x20) {
        cVar9 = ::std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        *)local_210,(key_type *)uVar12);
        if (cVar9.
            super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ._M_cur == (__node_type *)0x0) {
          local_2b8._0_8_ = local_2b8 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"main","");
          local_240._0_8_ =
               Catalog::GetEntry<duckdb::CollateCatalogEntry>
                         (local_270,context,(string *)local_2b8,(string *)uVar12,THROW_EXCEPTION,
                          (QueryErrorContext)0xffffffffffffffff);
          optional_ptr<duckdb::CollateCatalogEntry,_true>::CheckValid
                    ((optional_ptr<duckdb::CollateCatalogEntry,_true> *)local_240);
          uVar7 = local_240._0_8_;
          if ((CollateCatalogEntry *)local_2b8._0_8_ != (CollateCatalogEntry *)(local_2b8 + 0x10)) {
            operator_delete((void *)local_2b8._0_8_);
          }
          if (*(char *)&(((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(uVar7 + 0x238))->_M_h)._M_before_begin._M_nxt == '\x01') {
            local_2b8._0_8_ = uVar7;
            ::std::
            vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
            ::_M_insert_rval(&local_288,
                             (const_iterator)
                             local_288.
                             super__Vector_base<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,(value_type *)local_2b8);
          }
          else {
            if ((local_288.
                 super__Vector_base<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
                 ._M_impl.super__Vector_impl_data._M_start !=
                 local_288.
                 super__Vector_base<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) &&
               (pvVar10 = vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_true>::back
                                    ((vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_true>
                                      *)&local_288), pvVar10->_M_data->combinable == false)) {
              this = (BinderException *)__cxa_allocate_exception(0x10);
              local_2b8._0_8_ = local_2b8 + 0x10;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_2b8,"Cannot combine collation types \"%s\" and \"%s\"","");
              pvVar10 = vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_true>::back
                                  ((vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_true>
                                    *)&local_288);
              local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
              pcVar3 = (pvVar10->_M_data->super_StandardEntry).super_InCatalogEntry.
                       super_CatalogEntry.name._M_dataplus._M_p;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_198,pcVar3,
                         pcVar3 + (pvVar10->_M_data->super_StandardEntry).super_InCatalogEntry.
                                  super_CatalogEntry.name._M_string_length);
              local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
              sVar4 = (((case_insensitive_map_t<reference<CommonTableExpressionInfo>_> *)
                       (uVar7 + 0x18))->_M_h)._M_bucket_count;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1b8,sVar4,
                         (long)&((((case_insensitive_map_t<reference<CommonTableExpressionInfo>_> *)
                                  (uVar7 + 0x18))->_M_h)._M_before_begin._M_nxt)->_M_nxt + sVar4);
              BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                        (this,(string *)local_2b8,&local_198,&local_1b8);
              __cxa_throw(this,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
            }
            local_2b8._0_8_ = uVar7;
            if (local_288.
                super__Vector_base<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_288.
                super__Vector_base<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              ::std::
              vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>>>
              ::_M_realloc_insert<std::reference_wrapper<duckdb::CollateCatalogEntry>>
                        ((vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>>>
                          *)&local_288,
                         (iterator)
                         local_288.
                         super__Vector_base<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
                         (reference_wrapper<duckdb::CollateCatalogEntry> *)local_2b8);
            }
            else {
              (local_288.
               super__Vector_base<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->_M_data = (CollateCatalogEntry *)uVar7;
              local_288.
              super__Vector_base<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_288.
                   super__Vector_base<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
          }
          local_2b8._0_8_ = (CollateCatalogEntry *)local_210;
          ::std::
          _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                    ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)local_210,uVar12,local_2b8);
        }
        prVar5 = local_288.
                 super__Vector_base<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      bVar17 = local_288.
               super__Vector_base<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
               ._M_impl.super__Vector_impl_data._M_start == prVar5;
      if ((!bVar17) &&
         ((pCVar15 = (local_288.
                      super__Vector_base<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_data,
          local_28c != COMBINABLE_COLLATIONS || (pCVar15->combinable != false)))) {
        local_270 = (Catalog *)&PTR__BaseScalarFunction_02482b00;
        prVar16 = local_288.
                  super__Vector_base<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 1;
        do {
          uVar12 = local_240._16_8_;
          local_2b8._0_8_ = (CollateCatalogEntry *)0x0;
          local_2b8._8_8_ = (pointer)0x0;
          local_2b8._16_8_ = 0;
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                      *)local_2b8,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)local_240._16_8_);
          FunctionBinder::FunctionBinder((FunctionBinder *)local_240,context);
          SimpleFunction::SimpleFunction
                    (&local_158.super_SimpleFunction,(SimpleFunction *)&pCVar15->function);
          local_158.super_SimpleFunction.super_Function._vptr_Function = (_func_int **)local_270;
          LogicalType::LogicalType
                    (&local_158.return_type,
                     &(pCVar15->function).super_BaseScalarFunction.return_type);
          local_158.stability = (pCVar15->function).super_BaseScalarFunction.stability;
          local_158.null_handling = (pCVar15->function).super_BaseScalarFunction.null_handling;
          local_158.errors = (pCVar15->function).super_BaseScalarFunction.errors;
          local_158.collation_handling =
               (pCVar15->function).super_BaseScalarFunction.collation_handling;
          local_158.super_SimpleFunction.super_Function._vptr_Function =
               (_func_int **)&PTR__ScalarFunction_02476950;
          ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
          function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                    *)&local_a8,&(pCVar15->function).function);
          pp_Var13 = &(pCVar15->function).bind;
          puVar14 = local_88;
          for (lVar11 = 9; lVar11 != 0; lVar11 = lVar11 + -1) {
            *puVar14 = *pp_Var13;
            pp_Var13 = pp_Var13 + (ulong)bVar18 * -2 + 1;
            puVar14 = puVar14 + (ulong)bVar18 * -2 + 1;
          }
          local_40._M_unused._M_object =
               (pCVar15->function).function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_40._8_8_ =
               (pCVar15->function).function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_)->_M_use_count +
                   1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_)->_M_use_count +
                   1;
            }
          }
          auStack_1e0._8_8_ = local_2b8._0_8_;
          pLStack_1d0 = (pointer)local_2b8._8_8_;
          local_1c8._M_i = local_2b8._16_8_;
          local_2b8._0_8_ = (CollateCatalogEntry *)0x0;
          local_2b8._8_8_ = (pointer)0x0;
          local_2b8._16_8_ = 0;
          FunctionBinder::BindScalarFunction
                    ((FunctionBinder *)local_268,(ScalarFunction *)local_240,
                     (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                      *)&local_158,
                     SUB81((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                            *)(auStack_1e0 + 8),0),(optional_ptr<duckdb::Binder,_true>)0x0);
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     *)(auStack_1e0 + 8));
          local_158.super_SimpleFunction.super_Function._vptr_Function =
               (_func_int **)&PTR__ScalarFunction_02476950;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_);
          }
          if (local_98 != (pointer)0x0) {
            (*(code *)local_98)(&local_a8,&local_a8,__destroy_functor);
          }
          BaseScalarFunction::~BaseScalarFunction(&local_158);
          auVar6 = local_268;
          local_268 = (undefined1  [8])0x0;
          _Var2._M_head_impl =
               *(Expression **)
                &(((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *)
                  uVar12)->_M_t).
                 super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
          ;
          (((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *)uVar12)->
          _M_t).super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_> =
               (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
               auVar6;
          if ((_Head_base<0UL,_duckdb::Expression_*,_false>)_Var2._M_head_impl !=
              (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0) {
            (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))();
          }
          if (local_268 != (undefined1  [8])0x0) {
            (*((BaseExpression *)local_268)->_vptr_BaseExpression[1])();
          }
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     *)local_2b8);
          bVar17 = prVar16 == prVar5;
          if (bVar17) break;
          prVar1 = prVar16 + 1;
          pCVar15 = prVar16->_M_data;
          prVar16 = prVar1;
        } while ((local_28c != COMBINABLE_COLLATIONS) || (pCVar15->combinable != false));
      }
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)local_210);
      if (local_288.
          super__Vector_base<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (reference_wrapper<duckdb::CollateCatalogEntry> *)0x0) {
        operator_delete(local_288.
                        super__Vector_base<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_240 + 0x18));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p);
    }
  }
  else {
    bVar17 = false;
  }
  return bVar17;
}

Assistant:

bool PushVarcharCollation(ClientContext &context, unique_ptr<Expression> &source, const LogicalType &sql_type,
                          CollationType type) {
	if (sql_type.id() != LogicalTypeId::VARCHAR) {
		// only VARCHAR columns require collation
		return false;
	}
	// replace default collation with system collation
	auto str_collation = StringType::GetCollation(sql_type);
	string collation;
	if (str_collation.empty()) {
		collation = DBConfig::GetConfig(context).options.collation;
	} else {
		collation = str_collation;
	}
	collation = StringUtil::Lower(collation);
	// bind the collation
	if (collation.empty() || collation == "binary" || collation == "c" || collation == "posix") {
		// no collation or binary collation: skip
		return false;
	}
	auto &catalog = Catalog::GetSystemCatalog(context);
	auto splits = StringUtil::Split(StringUtil::Lower(collation), ".");
	vector<reference<CollateCatalogEntry>> entries;
	unordered_set<string> collations;
	for (auto &collation_argument : splits) {
		if (collations.count(collation_argument)) {
			// we already applied this collation
			continue;
		}
		auto &collation_entry = catalog.GetEntry<CollateCatalogEntry>(context, DEFAULT_SCHEMA, collation_argument);
		if (collation_entry.combinable) {
			entries.insert(entries.begin(), collation_entry);
		} else {
			if (!entries.empty() && !entries.back().get().combinable) {
				throw BinderException("Cannot combine collation types \"%s\" and \"%s\"", entries.back().get().name,
				                      collation_entry.name);
			}
			entries.push_back(collation_entry);
		}
		collations.insert(collation_argument);
	}
	for (auto &entry : entries) {
		auto &collation_entry = entry.get();
		if (!collation_entry.combinable && type == CollationType::COMBINABLE_COLLATIONS) {
			// not a combinable collation - ignore
			return false;
		}
		vector<unique_ptr<Expression>> children;
		children.push_back(std::move(source));

		FunctionBinder function_binder(context);
		auto function = function_binder.BindScalarFunction(collation_entry.function, std::move(children));
		source = std::move(function);
	}
	return true;
}